

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_finalizer(jit_State *J,TRef trcd,TRef trfin,cTValue *fin)

{
  TRef TVar1;
  cTValue *fin_local;
  TRef trfin_local;
  TRef trcd_local;
  jit_State *J_local;
  
  if (((int)(fin->field_4).it >> 0xf) + 4U < 0xfffffff7) {
    if (fin->u64 != 0xffffffffffffffff) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    fin_local._0_4_ = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
  }
  else {
    fin_local._0_4_ = trfin;
    if (trfin == 0) {
      fin_local._0_4_ = lj_ir_kptr_(J,IR_KPTR,(void *)(fin->u64 & 0x7fffffffffff));
    }
  }
  TVar1 = lj_ir_kint(J,(int)(fin->field_4).it >> 0xf);
  lj_ir_call(J,IRCALL_lj_cdata_setfin,(ulong)trcd,(ulong)(TRef)fin_local,(ulong)TVar1);
  J->needsnap = '\x01';
  return;
}

Assistant:

static void crec_finalizer(jit_State *J, TRef trcd, TRef trfin, cTValue *fin)
{
  if (tvisgcv(fin)) {
    if (!trfin) trfin = lj_ir_kptr(J, gcval(fin));
  } else if (tvisnil(fin)) {
    trfin = lj_ir_kptr(J, NULL);
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  lj_ir_call(J, IRCALL_lj_cdata_setfin, trcd,
	     trfin, lj_ir_kint(J, (int32_t)itype(fin)));
  J->needsnap = 1;
}